

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_int(FuncState *fs,int reg,lua_Integer i)

{
  int k;
  Value local_20;
  undefined1 local_18;
  
  if (i - 0x10001U < 0xfffffffffffe0000) {
    local_18 = 3;
    local_20.i = i;
    k = k2proto(fs,(TValue *)&local_20,(TValue *)&local_20);
    luaK_codek(fs,reg,k);
    return;
  }
  luaK_code(fs,((int)i * 0x8000 + 0x7fff8000U | reg << 7) + 1);
  return;
}

Assistant:

void luaK_int (FuncState *fs, int reg, lua_Integer i) {
  if (fitsBx(i))
    codeAsBx(fs, OP_LOADI, reg, cast_int(i));
  else
    luaK_codek(fs, reg, luaK_intK(fs, i));
}